

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringMeasure(PrintExpressionContents *this,StringMeasure *curr)

{
  ostream *poVar1;
  string_view local_38;
  string_view local_28;
  StringMeasure *local_18;
  StringMeasure *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (StringMeasure *)this;
  if (curr->op == StringMeasureUTF8) {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"string.measure_utf8");
    printMedium(poVar1,local_28);
  }
  else {
    if (curr->op != StringMeasureWTF16) {
      handle_unreachable("invalid string.measure*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9cf);
    }
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"string.measure_wtf16");
    printMedium(poVar1,local_38);
  }
  return;
}

Assistant:

void visitStringMeasure(StringMeasure* curr) {
    switch (curr->op) {
      case StringMeasureUTF8:
        printMedium(o, "string.measure_utf8");
        break;
      case StringMeasureWTF16:
        printMedium(o, "string.measure_wtf16");
        break;
      default:
        WASM_UNREACHABLE("invalid string.measure*");
    }
  }